

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O1

void __thiscall
Storage::Tape::TapePlayer::set_tape(TapePlayer *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  element_type *peVar1;
  Observer *pOVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint extraout_EDX;
  
  (this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  TimedEventLoop::reset_timer(&this->super_TimedEventLoop);
  peVar1 = (this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (this->current_pulse_).length.clock_rate = 1;
    (this->current_pulse_).type = Zero;
    (this->current_pulse_).length.length = 1;
  }
  else {
    iVar3 = (*peVar1->_vptr_Tape[7])(peVar1);
    (peVar1->pulse_).type = iVar3;
    (peVar1->pulse_).length.length = extraout_var;
    (peVar1->pulse_).length.clock_rate = extraout_EDX;
    peVar1->offset_ = peVar1->offset_ + 1;
    (this->current_pulse_).type = iVar3;
    (this->current_pulse_).length.length = extraout_var;
    (this->current_pulse_).length.clock_rate = extraout_EDX;
    iVar3 = (**((this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_Tape)();
    if (((char)iVar3 != '\0') &&
       (pOVar2 = (this->super_Source).observer_, pOVar2 != (Observer *)0x0)) {
      uVar4 = (**(this->super_Source)._vptr_Source)(&this->super_Source);
      (**pOVar2->_vptr_Observer)(pOVar2,&this->super_Source,(ulong)uVar4);
    }
  }
  TimedEventLoop::set_next_event_time_interval
            (&this->super_TimedEventLoop,(this->current_pulse_).length);
  pOVar2 = (this->super_Source).observer_;
  if (pOVar2 != (Observer *)0x0) {
    uVar4 = (**(this->super_Source)._vptr_Source)(&this->super_Source);
    (**pOVar2->_vptr_Observer)(pOVar2,&this->super_Source,(ulong)uVar4,*pOVar2->_vptr_Observer);
    return;
  }
  return;
}

Assistant:

void TapePlayer::set_tape(std::shared_ptr<Storage::Tape::Tape> tape) {
	tape_ = tape;
	reset_timer();
	get_next_pulse();
	update_clocking_observer();
}